

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void do_actual_learning_ldf<false>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *this;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this_00;
  label_t *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  wclass **ppwVar4;
  uint uVar5;
  pointer ppeVar6;
  example *peVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pvVar10;
  size_t sVar11;
  action_score *paVar12;
  pointer pvVar13;
  label_t lVar14;
  label_t lVar15;
  float *pfVar16;
  float *pfVar17;
  wclass *pwVar18;
  cbify *data_00;
  multi_learner *this_01;
  int iVar19;
  vw_exception *pvVar20;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *this_02;
  size_t i;
  ulong uVar21;
  size_t i_1;
  long lVar22;
  ulong uVar23;
  uint32_t chosen_action;
  cbify *local_238;
  multi_learner *local_230;
  cb_class cl;
  string local_218;
  string local_1f8;
  score_iterator local_1d8;
  score_iterator local_1c8;
  stringstream __msg;
  ostream local_1a8;
  
  this_02 = &data->cs_costs;
  this = &data->cb_costs;
  this_00 = &data->cb_as;
  local_238 = data;
  local_230 = base;
  std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>::
  resize(this_02,(long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3);
  std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize
            (this,(long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3);
  std::
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ::resize(this_00,(long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                         .super__Vector_impl_data._M_start >> 3);
  lVar22 = 0;
  for (uVar21 = 0; this_01 = local_230,
      ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar21 < (ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6 >> 3);
      uVar21 = uVar21 + 1) {
    peVar7 = ppeVar6[uVar21];
    pvVar8 = (this_02->
             super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (peVar7->l).multi;
    lVar15 = *(label_t *)&(peVar7->l).cs.costs._end;
    sVar11 = (peVar7->l).cs.costs.erase_count;
    puVar2 = (undefined8 *)((long)&pvVar8->end_array + lVar22);
    *puVar2 = (peVar7->l).cs.costs.end_array;
    puVar2[1] = sVar11;
    plVar1 = (label_t *)((long)&pvVar8->_begin + lVar22);
    *plVar1 = lVar14;
    plVar1[1] = lVar15;
    v_array<CB::cb_class>::clear
              ((v_array<CB::cb_class> *)
               ((long)&((this->
                        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar22));
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)
               ((long)&((this_00->
                        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar22));
    pvVar9 = (this->
             super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    plVar1 = (label_t *)((long)&pvVar9->_begin + lVar22);
    lVar14 = *plVar1;
    lVar15 = plVar1[1];
    puVar2 = (undefined8 *)((long)&pvVar9->end_array + lVar22);
    sVar11 = puVar2[1];
    (peVar7->l).cs.costs.end_array = (wclass *)*puVar2;
    (peVar7->l).cs.costs.erase_count = sVar11;
    (peVar7->l).multi = lVar14;
    *(label_t *)&(peVar7->l).cs.costs._end = lVar15;
    pvVar10 = (this_00->
              super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (undefined8 *)((long)&pvVar10->_begin + lVar22);
    pfVar16 = (float *)puVar2[1];
    puVar3 = (undefined8 *)((long)&pvVar10->end_array + lVar22);
    pfVar17 = (float *)*puVar3;
    sVar11 = puVar3[1];
    (peVar7->pred).scalars._begin = (float *)*puVar2;
    (peVar7->pred).scalars._end = pfVar16;
    (peVar7->pred).scalars.end_array = pfVar17;
    (peVar7->pred).scalars.erase_count = sVar11;
    lVar22 = lVar22 + 0x20;
  }
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (local_230,ec_seq,0);
  data_00 = local_238;
  peVar7 = *(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  sVar11 = local_238->example_counter;
  local_238->example_counter = sVar11 + 1;
  local_1c8._p = (action_score *)(peVar7->pred).scalars._begin;
  local_1c8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_1d8._p = (action_score *)(peVar7->pred).scalars._end;
  local_1d8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar19 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar11 + local_238->app_seed,&local_1c8,&local_1d8,&chosen_action);
  if (iVar19 == 0) {
    paVar12 = (peVar7->pred).a_s._begin;
    uVar5 = paVar12[chosen_action].action;
    cl.action = uVar5 + 1;
    cl.probability = paVar12[chosen_action].score;
    if (cl.action != 0) {
      cl.cost = loss_csldf(data_00,this_02,cl.action);
      v_array<CB::cb_class>::push_back
                ((v_array<CB::cb_class> *)
                 &((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5]->l).simple,&cl);
      LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
                (this_01,ec_seq,0);
      uVar21 = (ulong)(cl.action - 1);
      for (uVar23 = 0;
          ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start,
          uVar23 < (ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar6 >> 3);
          uVar23 = uVar23 + 1) {
        if (uVar21 == uVar23) {
          (ppeVar6[uVar21]->pred).multiclass = cl.action;
          pvVar13 = (this_02->
                    super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          peVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
          pvVar8 = pvVar13 + uVar21;
          lVar14 = (label_t)pvVar8->_begin;
          pwVar18 = pvVar8->_end;
          ppwVar4 = &pvVar13[uVar21].end_array;
          sVar11 = (size_t)ppwVar4[1];
          (peVar7->l).cs.costs.end_array = *ppwVar4;
          (peVar7->l).cs.costs.erase_count = sVar11;
          (peVar7->l).multi = lVar14;
          (peVar7->l).cs.costs._end = pwVar18;
        }
        else {
          (ppeVar6[uVar23]->pred).scalar = 0.0;
        }
      }
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_1a8,"No action with non-zero probability found!");
    pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x118,&local_218);
    __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"Failed to sample from pdf");
  pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
             ,0x111,&local_1f8);
  __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  auto& cs_costs = data.cs_costs;
  auto& cb_costs = data.cb_costs;
  auto& cb_as = data.cb_as;

  // change label and pred data for cb
  cs_costs.resize(ec_seq.size());
  cb_costs.resize(ec_seq.size());
  cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    cs_costs[i] = ec.l.cs.costs;
    cb_costs[i].clear();
    cb_as[i].clear();
    ec.l.cb.costs = cb_costs[i];
    ec.pred.a_s = cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, cs_costs, cl.action);

  // add cb label to chosen action
  auto& lab = ec_seq[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    if (i == cl.action - 1)
    {
      ec_seq[i]->pred.multiclass = cl.action;
      ec_seq[i]->l.cs.costs = cs_costs[cl.action - 1]; // only need this cost for eval
    }
    else
      ec_seq[i]->pred.multiclass = 0;
  }
}